

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O0

int bmp_create_bool(char *filename,uint32_t w,uint32_t h,_Bool *data)

{
  uint uVar1;
  uint8_t *data_00;
  FILE *__s;
  int local_44;
  uint local_40;
  int local_3c;
  int j;
  int i;
  uint8_t *filedata;
  uint32_t filesize;
  int index;
  FILE *f;
  _Bool *data_local;
  uint32_t h_local;
  uint32_t w_local;
  char *filename_local;
  
  uVar1 = w * h * 3 + 0x36;
  data_00 = (uint8_t *)malloc((ulong)uVar1);
  filedata._4_4_ = create_header(filename,w,h,data_00);
  for (local_3c = h - 1; -1 < local_3c; local_3c = local_3c + -1) {
    for (local_40 = 0; local_40 < w; local_40 = local_40 + 1) {
      if ((data[local_3c * w + local_40] & 1U) == 1) {
        data_00[filedata._4_4_] = '\0';
        data_00[filedata._4_4_ + 1] = '\0';
        data_00[filedata._4_4_ + 2] = '\0';
      }
      else {
        data_00[filedata._4_4_] = 0xff;
        data_00[filedata._4_4_ + 1] = 0xff;
        data_00[filedata._4_4_ + 2] = 0xff;
      }
      filedata._4_4_ = filedata._4_4_ + 3;
    }
    if ((w & 3) == 0) {
      local_44 = 0;
    }
    else {
      local_44 = 4 - (w & 3);
    }
    filedata._4_4_ = local_44 + filedata._4_4_;
  }
  __s = fopen(filename,"w");
  fwrite(data_00,1,(ulong)uVar1,__s);
  fclose(__s);
  free(data_00);
  return 0;
}

Assistant:

int bmp_create_bool(char* filename, uint32_t w, uint32_t h, bool* data) {

	FILE *f;
	int index = 0;

	uint32_t filesize = BMP_FILE_HEADER_SIZE + BMP_INFO_HEADER_SIZE + w * h * 3;
	uint8_t* filedata = (uint8_t*)malloc(filesize);

	//Create header
	index += create_header(filename, w, h, filedata);

	//Write data
	for (int i = h - 1; i >= 0; i--) {
		for (int j = 0; j < w; j++) {
			if (data[i * w + j] == true) {
				filedata[index + 0] = 0x00;
				filedata[index + 1] = 0x00;
				filedata[index + 2] = 0x00;
			} else {
				filedata[index + 0] = 0xFF;
				filedata[index + 1] = 0xFF;
				filedata[index + 2] = 0xFF;
			}
			index += 3;
		}

		//Padding should ensure each section is word aligned
		//TODO: this is broken
		index += (w % 4 != 0) ? 4 - (w % 4) : 0;
	}

	//Write file
	f = fopen(filename, "w");
	fwrite(filedata, 1, filesize, f);
	fclose(f);

	free(filedata);

	return 0;
}